

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O2

void __thiscall
HtmlModelSerialiserPrivate::writeHtmlVariant
          (HtmlModelSerialiserPrivate *this,QXmlStreamWriter *writer,QVariant *val)

{
  int iVar1;
  QArrayDataPointer<char16_t> *this_00;
  QLatin1String latin1;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  
  iVar1 = ::QVariant::typeId(val);
  if ((iVar1 - 0x1001U < 9) && ((0x121U >> (iVar1 - 0x1001U & 0x1f) & 1) != 0)) {
    local_a0.d = (Data *)0x0;
    local_a0.ptr = L"img";
    local_a0.size = 3;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    QXmlStreamWriter::writeEmptyElement((QString *)writer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    local_a0.d = (Data *)0x0;
    local_a0.ptr = L"src";
    local_a0.size = 3;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    latin1.m_data = "data:image/png;base64,";
    latin1.m_size = 0x16;
    QString::QString((QString *)&local_58,latin1);
    AbstractStringSerialiserPrivate::saveVariant
              ((QString *)&local_40,&this->super_AbstractStringSerialiserPrivate,val);
    operator+((QString *)&local_70,(QString *)&local_58,(QString *)&local_40);
    QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    local_a0.d = (Data *)0x0;
    local_a0.ptr = L"alt";
    local_a0.size = 3;
    local_88.size = 0;
    local_70.d = (Data *)0x0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_70.ptr = L"modelimage.png";
    local_70.size = 0xe;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    this_00 = &local_88;
  }
  else {
    AbstractStringSerialiserPrivate::saveVariant
              ((QString *)&local_a0,&this->super_AbstractStringSerialiserPrivate,val);
    QXmlStreamWriter::writeCharacters((QString *)writer);
    this_00 = &local_a0;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  return;
}

Assistant:

void HtmlModelSerialiserPrivate::writeHtmlVariant(QXmlStreamWriter &writer, const QVariant &val) const
{
    if (isImageType(val.userType())) {
        writer.writeEmptyElement(QStringLiteral("img"));
        writer.writeAttribute(QStringLiteral("src"), QLatin1String("data:image/png;base64,") + saveVariant(val));
        writer.writeAttribute(QStringLiteral("alt"), QStringLiteral("modelimage.png"));
        return;
    }
    writer.writeCharacters(saveVariant(val));
}